

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  bitset_container_t *c;
  _Bool _Var1;
  uint8_t typecode;
  uint i;
  int iVar2;
  array_container_t *src;
  run_container_t *c_00;
  uint16_t hb;
  uint16_t lb_start;
  uint16_t lb_end;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint8_t local_51;
  bitset_container_t *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  if (range_end <= range_start) {
    return;
  }
  uVar3 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar3 = range_end;
  }
  hb = (uint16_t)(range_start >> 0x10);
  uVar4 = uVar3 - 1;
  uVar5 = (uint)(uVar4 >> 0x10) & 0xffff;
  lb_start = (uint16_t)range_start;
  if ((uint16_t)(uVar4 >> 0x10) == hb) {
    lb_end = (uint16_t)uVar4;
  }
  else {
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,0xffff);
      hb = hb + 1;
    }
    local_38 = uVar4 & 0xffff;
    bVar7 = local_38 != 0xffff;
    local_44 = uVar5;
    local_40 = uVar4;
    for (uVar6 = (uint)hb; uVar6 <= (uVar5 - bVar7 & 0xffff); uVar6 = uVar6 + 1) {
      i = ra_get_index(&x1->high_low_container,(uint16_t)uVar6);
      if ((int)i < 0) {
        c_00 = run_container_create_range(0,0x10000);
        ra_insert_new_key_value_at(&x1->high_low_container,~i,(uint16_t)uVar6,c_00,'\x03');
      }
      else {
        local_51 = (x1->high_low_container).typecodes[i & 0xffff];
        src = (array_container_t *)
              get_writable_copy_if_shared((x1->high_low_container).containers[i & 0xffff],&local_51)
        ;
        local_50 = (bitset_container_t *)0x0;
        if (local_51 == '\x03') {
          iVar2 = run_container_negation_inplace((run_container_t *)src,&local_50);
          typecode = (uint8_t)iVar2;
        }
        else if (local_51 == '\x02') {
          local_50 = bitset_container_create();
          array_container_negation(src,local_50);
          array_container_free(src);
          typecode = '\x01';
        }
        else {
          if (local_51 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x186b,"container_t *container_inot(container_t *, uint8_t, uint8_t *)");
          }
          _Var1 = bitset_container_negation_inplace((bitset_container_t *)src,&local_50);
          typecode = '\x02' - _Var1;
        }
        c = local_50;
        iVar2 = container_get_cardinality(local_50,typecode);
        if (iVar2 == 0) {
          container_free(c,typecode);
          ra_remove_at_index(&x1->high_low_container,i);
        }
        else {
          ra_set_container_at_index(&x1->high_low_container,i,c,typecode);
        }
      }
    }
    if ((int)local_38 == 0xffff) {
      return;
    }
    lb_start = 0;
    hb = (uint16_t)local_44;
    lb_end = (uint16_t)local_40;
  }
  inplace_flip_container(&x1->high_low_container,hb,lb_start,lb_end);
  return;
}

Assistant:

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1, uint64_t range_start,
                                 uint64_t range_end) {
    if (range_start >= range_end) {
        return;  // empty range
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}